

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O3

int32_t __thiscall icu_63::Calendar::getLocalDOW(Calendar *this)

{
  int iVar1;
  UCalendarDateFields UVar2;
  int iVar3;
  
  UVar2 = resolveFields(this,(UFieldResolutionTable *)kDOWPrecedence);
  if (UVar2 == UCAL_DOW_LOCAL) {
    iVar3 = this->fFields[0x12] + -1;
  }
  else {
    iVar3 = 0;
    if (UVar2 == UCAL_DAY_OF_WEEK) {
      iVar3 = this->fFields[7] - this->fFirstDayOfWeek;
    }
  }
  iVar1 = iVar3 % 7 + 7;
  if (-1 < iVar3 % 7) {
    iVar1 = iVar3 % 7;
  }
  return iVar1;
}

Assistant:

int32_t Calendar::getLocalDOW()
{
  // Get zero-based localized DOW, valid range 0..6.  This is the DOW
    // we are looking for.
    int32_t dowLocal = 0;
    switch (resolveFields(kDOWPrecedence)) {
    case UCAL_DAY_OF_WEEK:
        dowLocal = internalGet(UCAL_DAY_OF_WEEK) - fFirstDayOfWeek;
        break;
    case UCAL_DOW_LOCAL:
        dowLocal = internalGet(UCAL_DOW_LOCAL) - 1;
        break;
    default:
        break;
    }
    dowLocal = dowLocal % 7;
    if (dowLocal < 0) {
        dowLocal += 7;
    }
    return dowLocal;
}